

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

void slider_size_cb(Fl_Value_Input *i,void *v)

{
  double v_00;
  Fl_Type *pFVar1;
  bool bVar2;
  int iVar3;
  Fl_Widget_Type *q;
  Fl_Type **ppFVar4;
  
  if ((char *)v == "LOAD") {
    iVar3 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x21])();
    (*(((i->super_Fl_Valuator).super_Fl_Widget.parent_)->super_Fl_Widget)._vptr_Fl_Widget
      [(ulong)(iVar3 != 0) + 5])();
    iVar3 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1c])();
    if (iVar3 < 2) {
      Fl_Widget::deactivate((Fl_Widget *)i);
      return;
    }
    Fl_Widget::activate((Fl_Widget *)i);
    Fl_Valuator::value(&i->super_Fl_Valuator,(double)(float)current_widget->o[1].h_);
    return;
  }
  v_00 = (i->super_Fl_Valuator).value_;
  bVar2 = false;
  ppFVar4 = &Fl_Type::first;
  while (pFVar1 = *ppFVar4, pFVar1 != (Fl_Type *)0x0) {
    if (pFVar1->selected != '\0') {
      iVar3 = (*pFVar1->_vptr_Fl_Type[0x17])(pFVar1);
      if (iVar3 != 0) {
        iVar3 = (*pFVar1->_vptr_Fl_Type[0x1c])(pFVar1);
        if (1 < iVar3) {
          Fl_Slider::slider_size((Fl_Slider *)pFVar1[1].prev,v_00);
          Fl_Widget::redraw((Fl_Widget *)pFVar1[1].prev);
          bVar2 = true;
        }
      }
    }
    ppFVar4 = &pFVar1->next;
  }
  if (bVar2) {
    set_modflag(1);
    return;
  }
  return;
}

Assistant:

void slider_size_cb(Fl_Value_Input* i, void* v) {
  if (v == LOAD) {
    if (current_widget->is_window()) 
      i->parent()->hide(); 
    else
      i->parent()->show();
    if (current_widget->is_valuator()<2) {i->deactivate(); return;}
    i->activate();
    i->value(((Fl_Slider*)(current_widget->o))->slider_size());
  } else {
    int mod = 0;
    double n = i->value();
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	if (q->is_valuator()>=2) {
	  ((Fl_Slider*)(q->o))->slider_size(n);
	  q->o->redraw();
	  mod = 1;
	}
      }
    }
    if (mod) set_modflag(1);
  }
}